

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcProve.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkMiterRwsat(Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkRewrite(pNtk,0,0,0,0,0);
  pNtk_00 = Abc_NtkBalance(pNtk,0,0,0);
  Abc_NtkDelete(pNtk);
  Abc_NtkRewrite(pNtk_00,0,0,0,0,0);
  Abc_NtkRefactor(pNtk_00,10,0x10,0,0,0,0);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterRwsat( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkTemp;
    Abc_NtkRewrite( pNtk, 0, 0, 0, 0, 0 );
    pNtk = Abc_NtkBalance( pNtkTemp = pNtk, 0, 0, 0 );  Abc_NtkDelete( pNtkTemp );
    Abc_NtkRewrite( pNtk, 0, 0, 0, 0, 0 );
    Abc_NtkRefactor( pNtk, 10, 16, 0, 0, 0, 0 );
    return pNtk;
}